

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

void uhash_close_63(UHashtable *hash)

{
  UHashElement *pUVar1;
  UHashElement *e;
  UHashtable *pUStack_10;
  int32_t pos;
  UHashtable *hash_local;
  
  if (hash != (UHashtable *)0x0) {
    pUStack_10 = hash;
    if (hash->elements != (UHashElement *)0x0) {
      if ((hash->keyDeleter != (UObjectDeleter *)0x0) ||
         (hash->valueDeleter != (UObjectDeleter *)0x0)) {
        e._4_4_ = 0xffffffff;
        while (pUVar1 = uhash_nextElement_63(pUStack_10,(int32_t *)((long)&e + 4)),
              pUVar1 != (UHashElement *)0x0) {
          if ((pUStack_10->keyDeleter != (UObjectDeleter *)0x0) &&
             ((pUVar1->key).pointer != (void *)0x0)) {
            (*pUStack_10->keyDeleter)((pUVar1->key).pointer);
          }
          if ((pUStack_10->valueDeleter != (UObjectDeleter *)0x0) &&
             ((pUVar1->value).pointer != (void *)0x0)) {
            (*pUStack_10->valueDeleter)((pUVar1->value).pointer);
          }
        }
      }
      uprv_free_63(pUStack_10->elements);
      pUStack_10->elements = (UHashElement *)0x0;
    }
    if (pUStack_10->allocated != '\0') {
      uprv_free_63(pUStack_10);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_close(UHashtable *hash) {
    if (hash == NULL) {
        return;
    }
    if (hash->elements != NULL) {
        if (hash->keyDeleter != NULL || hash->valueDeleter != NULL) {
            int32_t pos=UHASH_FIRST;
            UHashElement *e;
            while ((e = (UHashElement*) uhash_nextElement(hash, &pos)) != NULL) {
                HASH_DELETE_KEY_VALUE(hash, e->key.pointer, e->value.pointer);
            }
        }
        uprv_free(hash->elements);
        hash->elements = NULL;
    }
    if (hash->allocated) {
        uprv_free(hash);
    }
}